

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_fill_set(lyxp_set *trg,lyxp_set *src)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  lyxp_set_nodes *__dest;
  LY_ERR *pLVar3;
  
  if (src != (lyxp_set *)0x0 && trg != (lyxp_set *)0x0) {
    switch(src->type) {
    case LYXP_SET_SNODE_SET:
      trg->type = LYXP_SET_SNODE_SET;
      trg->used = src->used;
      uVar1 = src->used;
      trg->size = uVar1;
      __dest = (lyxp_set_nodes *)ly_realloc((trg->val).nodes,(ulong)uVar1 << 4);
      break;
    case LYXP_SET_BOOLEAN:
      set_fill_boolean(trg,(src->val).bool);
      return;
    case LYXP_SET_NUMBER:
      set_fill_number(trg,(src->val).num);
      return;
    case LYXP_SET_STRING:
      __s = (src->val).str;
      sVar2 = strlen(__s);
      set_fill_string(trg,__s,(uint16_t)sVar2);
      return;
    default:
      if ((trg->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
        free((trg->val).nodes);
      }
      if (src->type != LYXP_SET_NODE_SET) {
        if (src->type == LYXP_SET_EMPTY) {
          trg->type = LYXP_SET_EMPTY;
          return;
        }
        __assert_fail("src->type == LYXP_SET_NODE_SET",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x2d3,"void set_fill_set(struct lyxp_set *, struct lyxp_set *)");
      }
      trg->type = LYXP_SET_NODE_SET;
      uVar1 = src->used;
      trg->used = uVar1;
      trg->size = src->used;
      trg->ctx_pos = src->ctx_pos;
      trg->ctx_size = src->ctx_size;
      __dest = (lyxp_set_nodes *)malloc((ulong)uVar1 << 4);
    }
    (trg->val).nodes = __dest;
    if (__dest != (lyxp_set_nodes *)0x0) {
      memcpy(__dest,(src->val).nodes,(ulong)src->used << 4);
      return;
    }
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_fill_set");
    trg->used = 0;
    trg->size = 0;
    trg->ctx_pos = 0;
    trg->ctx_size = 0;
    (trg->val).nodes = (lyxp_set_nodes *)0x0;
    *(undefined8 *)((long)&trg->val + 8) = 0;
    *(undefined8 *)trg = 0;
    *(undefined8 *)&trg->field_0x8 = 0;
  }
  return;
}

Assistant:

static void
set_fill_set(struct lyxp_set *trg, struct lyxp_set *src)
{
    if (!trg || !src) {
        return;
    }

    if (src->type == LYXP_SET_SNODE_SET) {
        trg->type = LYXP_SET_SNODE_SET;
        trg->used = src->used;
        trg->size = src->used;

        trg->val.snodes = ly_realloc(trg->val.snodes, trg->size * sizeof *trg->val.nodes);
        if (!trg->val.nodes) {
            LOGMEM;
            memset(trg, 0, sizeof *trg);
            return;
        }

        memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
    } else if (src->type == LYXP_SET_BOOLEAN) {
        set_fill_boolean(trg, src->val.bool);
    } else if (src->type ==  LYXP_SET_NUMBER) {
        set_fill_number(trg, src->val.num);
    } else if (src->type == LYXP_SET_STRING) {
        set_fill_string(trg, src->val.str, strlen(src->val.str));
    } else {
        if (trg->type == LYXP_SET_NODE_SET) {
            free(trg->val.nodes);
        } else if (trg->type == LYXP_SET_STRING) {
            free(trg->val.str);
        }

        if (src->type == LYXP_SET_EMPTY) {
            trg->type = LYXP_SET_EMPTY;
        } else {
            assert(src->type == LYXP_SET_NODE_SET);

            trg->type = LYXP_SET_NODE_SET;
            trg->used = src->used;
            trg->size = src->used;
            trg->ctx_pos = src->ctx_pos;
            trg->ctx_size = src->ctx_size;

            trg->val.nodes = malloc(trg->used * sizeof *trg->val.nodes);
            if (!trg->val.nodes) {
                LOGMEM;
                memset(trg, 0, sizeof *trg);
                return;
            }

            memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
        }
    }


}